

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

void mcu8str_append(mcu8str *str,mcu8str *otherstr)

{
  uint uVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  mcu8str_size_t newsize;
  
  if (*(int *)(in_RSI + 1) != 0) {
    uVar1 = (int)in_RDI[1] + *(int *)(in_RSI + 1);
    if ((ulong)*(uint *)((long)in_RDI + 0xc) < (ulong)uVar1 + 1) {
      mcu8str_reserve((mcu8str *)newsize,(mcu8str_size_t)in_RDI);
    }
    memcpy((void *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1)),(void *)*in_RSI,
           (ulong)*(uint *)(in_RSI + 1));
    *(undefined1 *)(*in_RDI + (ulong)uVar1) = 0;
    *(uint *)(in_RDI + 1) = uVar1;
  }
  return;
}

Assistant:

void mcu8str_append( mcu8str* str, const mcu8str * otherstr )
  {
    if ( otherstr->size == 0 )
      return;
    mcu8str_size_t newsize = str->size + otherstr->size;
    if ( newsize + 1 > str->buflen )
      mcu8str_reserve( str, newsize );
    //memcpy ok since we handle the null char afterwards, there will be no
    //overlapping even if str==otherstr:
    STDNS memcpy( str->c_str + str->size,
                  otherstr->c_str,
                  otherstr->size );
    str->c_str[newsize] = '\0';
    str->size = (unsigned)newsize;//cast ok, mcu8str_reserve checked.
  }